

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               (string *filename,vector<unsigned_long,_std::allocator<unsigned_long>_> *homology,
               string *out_filename)

{
  pointer *ppuVar1;
  pointer puVar2;
  ulong *puVar3;
  bool bVar4;
  char cVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  pointer puVar9;
  char cVar10;
  long lVar11;
  ulong uVar12;
  ulong *puVar13;
  string __str;
  unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
  output;
  flagser_parameters params;
  filtered_directed_graph_t graph;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  result;
  directed_flag_complex_in_memory_computer_t complex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3c0;
  output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *local_3a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_398;
  string local_380;
  undefined1 local_360 [64];
  _Alloc_hider local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  char *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Head_base<0UL,_filtration_algorithm_t_*,_false> local_2a0;
  filtered_directed_graph_t local_298;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  local_1c0;
  directed_flag_complex_in_memory_computer_t local_e8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,filename->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"...",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  flagser_parameters::flagser_parameters((flagser_parameters *)local_360);
  pcVar7 = "barcode";
  if (out_filename->_M_string_length == 0) {
    pcVar7 = "none";
  }
  std::__cxx11::string::_M_replace((ulong)&local_300,0,local_2f8,(ulong)pcVar7);
  if (out_filename->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_320);
  }
  local_360[0xd] = true;
  std::__cxx11::string::string
            ((string *)&local_380,(filename->_M_dataplus)._M_p,(allocator *)&local_1c0);
  read_filtered_directed_graph(&local_298,&local_380,(flagser_parameters *)local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  get_output<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((flagser_parameters *)&local_3a0);
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
  directed_flag_complex_in_memory_computer_t(&local_e8,&local_298,(flagser_parameters *)local_360);
  (*local_3a0->_vptr_output_t[2])(local_3a0,&local_e8);
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::persistence_computer_t(&local_1c0,&local_e8,local_3a0,0xffffffffffffffff,2,3.4028235e+38);
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::compute_persistence(&local_1c0,0,0xffff,true);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3c0,&local_1c0.betti_numbers);
  lVar11 = CONCAT44(local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                    (uint)local_3c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish) -
           (long)local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
  puVar9 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pointer *)
      local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (lVar11 == (long)puVar9 - (long)puVar2) {
    if ((homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      uVar12 = 0;
      do {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_3c0,&local_1c0.betti_numbers);
        puVar9 = (pointer)local_3c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar12];
        puVar2 = (pointer)(homology->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar12];
        if ((pointer *)
            local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_3c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3c0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (puVar9 != puVar2) goto LAB_00130206;
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)(homology->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(homology->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
LAB_00130206:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Expected betti numbers: ",0x18);
    puVar13 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar13 != puVar3) {
      ppuVar1 = &local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      do {
        uVar12 = *puVar13;
        cVar10 = '\x01';
        if (9 < uVar12) {
          uVar8 = uVar12;
          cVar5 = '\x04';
          do {
            cVar10 = cVar5;
            if (uVar8 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_00130297;
            }
            if (uVar8 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_00130297;
            }
            if (uVar8 < 10000) goto LAB_00130297;
            bVar4 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar5 = cVar10 + '\x04';
          } while (bVar4);
          cVar10 = cVar10 + '\x01';
        }
LAB_00130297:
        local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar1;
        std::__cxx11::string::_M_construct((ulong)&local_3c0,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_3c0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                   (uint)local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,uVar12);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)local_3c0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT44(local_3c0.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (uint)local_3c0.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_finish));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        if ((pointer *)
            local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar1) {
          operator_delete(local_3c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"; computed: ",0xc);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_398,&local_1c0.betti_numbers);
    if (local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppuVar1 = &local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      puVar9 = local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar12 = *puVar9;
        cVar10 = '\x01';
        if (9 < uVar12) {
          uVar8 = uVar12;
          cVar5 = '\x04';
          do {
            cVar10 = cVar5;
            if (uVar8 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_001303a1;
            }
            if (uVar8 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_001303a1;
            }
            if (uVar8 < 10000) goto LAB_001303a1;
            bVar4 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar5 = cVar10 + '\x04';
          } while (bVar4);
          cVar10 = cVar10 + '\x01';
        }
LAB_001303a1:
        local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar1;
        std::__cxx11::string::_M_construct((ulong)&local_3c0,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_3c0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                   (uint)local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,uVar12);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)local_3c0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT44(local_3c0.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (uint)local_3c0.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_finish));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        if ((pointer *)
            local_3c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar1) {
          operator_delete(local_3c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_398.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_398.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"All good.",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  if (local_1c0.cell_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.cell_count.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.cell_count.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.cell_count.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ::~vector(&local_1c0.birth_deaths_by_dim);
  if (local_1c0.betti_numbers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.betti_numbers.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.betti_numbers.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.betti_numbers.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>::~_Deque_base
            (&local_1c0.columns_to_reduce.
              super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>);
  if (local_1c0.multiplicative_inverse.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.multiplicative_inverse.
                    super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.multiplicative_inverse.
                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.multiplicative_inverse.
                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.coboundary_matrix_offsets.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.coboundary_matrix_offsets.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.coboundary_matrix_offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.coboundary_matrix_offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
  ~vector(&local_e8.coboundary_matrix);
  if (local_e8.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.next_filtration.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.next_filtration.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.next_filtration.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.cell_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.cell_count.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.cell_count.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.cell_count.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  directed_flag_complex_in_memory_t<std::pair<int,_float>_>::~directed_flag_complex_in_memory_t
            (&local_e8.flag_complex);
  if (local_3a0 !=
      (output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
       *)0x0) {
    (*local_3a0->_vptr_output_t[1])();
  }
  if (local_298.edge_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.edge_filtration.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.edge_filtration.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.edge_filtration.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.vertex_filtration.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.vertex_filtration.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super_directed_graph_t.incidence_outgoing.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super_directed_graph_t.incidence_outgoing.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super_directed_graph_t.incidence_outgoing.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super_directed_graph_t.incidence_outgoing.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super_directed_graph_t.incidence_incoming.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super_directed_graph_t.incidence_incoming.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super_directed_graph_t.incidence_incoming.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super_directed_graph_t.incidence_incoming.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super_directed_graph_t.indegrees.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super_directed_graph_t.indegrees.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super_directed_graph_t.indegrees.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super_directed_graph_t.indegrees.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super_directed_graph_t.outdegrees.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super_directed_graph_t.outdegrees.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super_directed_graph_t.outdegrees.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super_directed_graph_t.outdegrees.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super_directed_graph_t.edge_filtration.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_298.super_directed_graph_t.edge_filtration.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super_directed_graph_t.edge_filtration.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super_directed_graph_t.edge_filtration.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super_directed_graph_t.edges.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super_directed_graph_t.edges.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super_directed_graph_t.edges.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super_directed_graph_t.edges.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a0._M_head_impl != (filtration_algorithm_t *)0x0) {
    (*(local_2a0._M_head_impl)->_vptr_filtration_algorithm_t[1])();
  }
  local_2a0._M_head_impl = (filtration_algorithm_t *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_p != &local_2b0) {
    operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_p != &local_2d0) {
    operator_delete(local_2e0._M_p,local_2d0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_p != &local_2f0) {
    operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_p != &local_310) {
    operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_360._32_8_ != local_360 + 0x30) {
    operator_delete((void *)local_360._32_8_,local_360._48_8_ + 1);
  }
  return;
}

Assistant:

void compute(std::string&& filename, std::vector<size_t> homology, std::string out_filename = "") {
	std::cout << "Testing " << filename << "..." << std::endl;
	flagser_parameters params;
	params.output_format = out_filename.size() == 0 ? "none" : "barcode";
	if (out_filename.size() > 0) { params.output_name = out_filename; }
	params.directed = true;
	filtered_directed_graph_t graph = read_filtered_directed_graph(filename.c_str(), params);

	size_t max_entries = std::numeric_limits<size_t>::max();
	coefficient_t modulus = 2;

	unsigned short max_dimension = std::numeric_limits<unsigned short>::max();
	unsigned short min_dimension = 0;

	auto output = get_output<T>(params);
	T complex(graph, params);

	output->set_complex(&complex);

	auto result = persistence_computer_t<decltype(complex)>(complex, output.get(), max_entries, modulus);
	result.compute_persistence(min_dimension, max_dimension);

	bool correct = true;

	if (result.get_betti_numbers().size() != homology.size()) {
		correct = false;
	} else {
		for (auto i = 0ul; i < homology.size(); i++) {
			if (result.get_betti_numbers()[i] != homology[i]) {
				correct = false;
				break;
			}
		}
	}

	if (!correct) {
		std::cout << "Expected betti numbers: ";
		for (auto b : homology) std::cout << std::to_string(b) << " ";
		std::cout << "; computed: ";
		for (auto b : result.get_betti_numbers()) std::cout << std::to_string(b) << " ";
		std::cout << std::endl;
		std::cout << "FAILED" << std::endl;
		//   throw std::logic_error(std::string("Wrong betti numbers computed."));
	}

	std::cout << "All good." << std::endl;
}